

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateFastStringLdElem
          (Lowerer *this,Instr *ldElem,LabelInstr *labelHelper,LabelInstr *labelFallThru)

{
  code *pcVar1;
  bool bVar2;
  BYTE scale;
  uint32 uVar3;
  IndirOpnd *pIVar4;
  undefined4 *puVar5;
  Lowerer *pLVar6;
  IntConstOpnd *pIVar7;
  Lowerer *dst;
  IntConstOpnd *pIVar8;
  RegOpnd *pRVar9;
  RegOpnd *pRVar10;
  Opnd *src;
  Lowerer *pLVar11;
  undefined1 local_c0 [8];
  AutoReuseOpnd autoReuseCharOpnd;
  AutoReuseOpnd autoReuseCacheOpnd;
  AutoReuseOpnd autoReuseStringOpnd;
  AutoReuseOpnd autoReuseBufferOpnd;
  IndirOpnd *local_40;
  
  pIVar4 = IR::Opnd::AsIndirOpnd(ldElem->m_src1);
  pRVar9 = pIVar4->m_baseOpnd;
  autoReuseStringOpnd._16_2_ = (pRVar9->super_Opnd).m_valueType.field_0;
  bVar2 = ValueType::IsLikelyString((ValueType *)&autoReuseStringOpnd.autoDelete);
  if (bVar2) {
    bVar2 = IR::Opnd::IsTaggedInt(&pRVar9->super_Opnd);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x468c,"(!baseOpnd->IsTaggedInt())","!baseOpnd->IsTaggedInt()");
      if (!bVar2) goto LAB_0057d013;
      *puVar5 = 0;
    }
    pRVar10 = pIVar4->m_indexOpnd;
    if (pRVar10 != (RegOpnd *)0x0) {
      autoReuseStringOpnd._16_2_ = (pRVar10->super_Opnd).m_valueType.field_0;
      bVar2 = ValueType::IsLikelyInt((ValueType *)&autoReuseStringOpnd.autoDelete);
      if (!bVar2) goto LAB_0057cd11;
      bVar2 = IR::Opnd::IsNotInt(&pRVar10->super_Opnd);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x4696,"(!indexOpnd || !indexOpnd->IsNotInt())",
                           "!indexOpnd || !indexOpnd->IsNotInt()");
        if (!bVar2) {
LAB_0057d013:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
    GenerateStringTest(this,pRVar9,ldElem,labelHelper,(LabelInstr *)0x0,true);
    pLVar6 = (Lowerer *)IR::RegOpnd::New(TyUint64,this->m_func);
    IR::AutoReuseOpnd::AutoReuseOpnd
              ((AutoReuseOpnd *)&autoReuseStringOpnd.autoDelete,(Opnd *)pLVar6,this->m_func,true);
    if (pRVar10 == (RegOpnd *)0x0) {
      local_40 = IR::IndirOpnd::New((RegOpnd *)pLVar6,pIVar4->m_offset * 2,TyUint16,this->m_func,
                                    false);
      pIVar7 = IR::IntConstOpnd::New((ulong)(uint)pIVar4->m_offset,TyUint32,this->m_func,false);
    }
    else {
      pIVar7 = (IntConstOpnd *)GenerateUntagVar(this,pRVar10,labelHelper,ldElem,true);
      local_40 = IR::IndirOpnd::New((RegOpnd *)pLVar6,(RegOpnd *)pIVar7,'\x01',TyUint16,this->m_func
                                   );
    }
    dst = (Lowerer *)IR::RegOpnd::New(TyUint32,this->m_func);
    pIVar4 = IR::IndirOpnd::New(pRVar9,0x18,TyUint32,this->m_func,false);
    pLVar11 = dst;
    InsertMove((Opnd *)dst,&pIVar4->super_Opnd,ldElem,true);
    InsertCompareBranch(pLVar11,(Opnd *)dst,&pIVar7->super_Opnd,BrLe_A,true,labelHelper,ldElem,false
                       );
    pIVar4 = IR::IndirOpnd::New(pRVar9,0x10,TyUint64,this->m_func,false);
    pLVar11 = pLVar6;
    InsertMove((Opnd *)pLVar6,&pIVar4->super_Opnd,ldElem,true);
    GenerateNotZeroTest(pLVar11,(Opnd *)pLVar6,labelHelper,ldElem);
    if (DAT_01441ddf == '\x01') {
      bVar2 = IR::Opnd::IsIntConstOpnd(&pIVar7->super_Opnd);
      if (bVar2) {
        pIVar8 = IR::Opnd::AsIntConstOpnd(&pIVar7->super_Opnd);
        uVar3 = IR::IntConstOpnd::AsUint32(pIVar8);
        local_40->m_offset = uVar3 * 2;
        (local_40->super_Opnd).field_0xe = 0;
      }
      else {
        pIVar8 = IR::IntConstOpnd::New(0x7fffffff,TyInt32,this->m_func,false);
        InsertAnd(&pIVar7->super_Opnd,&pIVar7->super_Opnd,&pIVar8->super_Opnd,ldElem);
      }
      pRVar9 = IR::RegOpnd::New(TyInt32,this->m_func);
      InsertSub(false,&pRVar9->super_Opnd,&pIVar7->super_Opnd,(Opnd *)dst,ldElem);
      pIVar7 = IR::IntConstOpnd::New(0x1f,TyInt8,this->m_func,false);
      InsertShift(Shr_A,false,&pRVar9->super_Opnd,&pRVar9->super_Opnd,&pIVar7->super_Opnd,ldElem);
    }
    else {
      pRVar9 = (RegOpnd *)0x0;
    }
    pRVar10 = IR::RegOpnd::New(TyUint32,this->m_func);
    IR::AutoReuseOpnd::AutoReuseOpnd
              ((AutoReuseOpnd *)local_c0,&pRVar10->super_Opnd,this->m_func,true);
    InsertMove(&pRVar10->super_Opnd,&local_40->super_Opnd,ldElem,true);
    if (DAT_01441ddf == '\x01') {
      InsertAnd(&pRVar10->super_Opnd,&pRVar10->super_Opnd,&pRVar9->super_Opnd,ldElem);
    }
    pLVar6 = (Lowerer *)0x80;
    pIVar7 = IR::IntConstOpnd::New(0x80,TyUint16,this->m_func,false);
    InsertCompareBranch(pLVar6,&pRVar10->super_Opnd,&pIVar7->super_Opnd,BrGe_A,true,labelHelper,
                        ldElem,false);
    pRVar9 = IR::RegOpnd::New(TyUint64,this->m_func);
    IR::AutoReuseOpnd::AutoReuseOpnd
              ((AutoReuseOpnd *)&autoReuseCharOpnd.autoDelete,&pRVar9->super_Opnd,this->m_func,true)
    ;
    src = LoadLibraryValueOpnd(this,ldElem,ValueCharStringCache);
    InsertMove(&pRVar9->super_Opnd,src,ldElem,true);
    pLVar11 = (Lowerer *)IR::RegOpnd::New(TyUint64,this->m_func);
    IR::AutoReuseOpnd::AutoReuseOpnd
              ((AutoReuseOpnd *)&autoReuseCacheOpnd.autoDelete,(Opnd *)pLVar11,this->m_func,true);
    scale = LowererMDArch::GetDefaultIndirScale();
    pIVar4 = IR::IndirOpnd::New(pRVar9,pRVar10,scale,TyVar,this->m_func);
    pLVar6 = pLVar11;
    InsertMove((Opnd *)pLVar11,&pIVar4->super_Opnd,ldElem,true);
    GenerateNotZeroTest(pLVar6,(Opnd *)pLVar11,labelHelper,ldElem);
    InsertMove(ldElem->m_dst,(Opnd *)pLVar11,ldElem,true);
    InsertBranch(Br,labelFallThru,ldElem);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseCacheOpnd.autoDelete);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseCharOpnd.autoDelete);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_c0);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseStringOpnd.autoDelete);
    bVar2 = true;
  }
  else {
LAB_0057cd11:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
Lowerer::GenerateFastStringLdElem(IR::Instr * ldElem, IR::LabelInstr * labelHelper, IR::LabelInstr * labelFallThru)
{
    IR::IndirOpnd * indirOpnd = ldElem->GetSrc1()->AsIndirOpnd();
    IR::RegOpnd * baseOpnd = indirOpnd->GetBaseOpnd();

    // don't generate the fast path if the instance is not likely string
    if (!baseOpnd->GetValueType().IsLikelyString())
    {
        return false;
    }

    Assert(!baseOpnd->IsTaggedInt());

    IR::RegOpnd * indexOpnd = indirOpnd->GetIndexOpnd();
    // Don't generate the fast path if the index operand is not likely int
    if (indexOpnd && !indexOpnd->GetValueType().IsLikelyInt())
    {
        return false;
    }

    // Make sure the instance is a string
    Assert(!indexOpnd || !indexOpnd->IsNotInt());
    GenerateStringTest(baseOpnd, ldElem, labelHelper);

    IR::Opnd * index32CmpOpnd;
    IR::RegOpnd * bufferOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
    const IR::AutoReuseOpnd autoReuseBufferOpnd(bufferOpnd, m_func);
    IR::IndirOpnd * charIndirOpnd;
    if (indexOpnd)
    {
        // Untag the var and generate the indir into the string buffer
        IR::RegOpnd * index32Opnd = GenerateUntagVar(indexOpnd, labelHelper, ldElem);
        charIndirOpnd = IR::IndirOpnd::New(bufferOpnd, index32Opnd, 1, TyUint16, this->m_func);
        index32CmpOpnd = index32Opnd;
    }
    else
    {
        // Just use the offset to indirect into the string buffer
        charIndirOpnd = IR::IndirOpnd::New(bufferOpnd, indirOpnd->GetOffset() * sizeof(char16), TyUint16, this->m_func);
        index32CmpOpnd = IR::IntConstOpnd::New((uint32)indirOpnd->GetOffset(), TyUint32, this->m_func);
    }

    // Check if the index is in range of the string length
    //  CMP [baseOpnd + offset(length)], indexOpnd     --  string length
    //  JBE $helper                                    -- unsigned compare, and string length are at most INT_MAX - 1
    //                                                 -- so that even if we have a negative index, this will fail
    IR::RegOpnd* lengthOpnd = IR::RegOpnd::New(TyUint32, m_func);
    InsertMove(lengthOpnd, IR::IndirOpnd::New(baseOpnd, offsetof(Js::JavascriptString, m_charLength), TyUint32, this->m_func), ldElem);
    InsertCompareBranch(lengthOpnd, index32CmpOpnd, Js::OpCode::BrLe_A, true, labelHelper, ldElem);

    // Load the string buffer and make sure it is not null
    //  MOV bufferOpnd, [baseOpnd + offset(m_pszValue)]
    //  TEST bufferOpnd, bufferOpnd
    //  JEQ $labelHelper
    indirOpnd = IR::IndirOpnd::New(baseOpnd, offsetof(Js::JavascriptString, m_pszValue), TyMachPtr, this->m_func);

    InsertMove(bufferOpnd, indirOpnd, ldElem);
    GenerateNotZeroTest(bufferOpnd, labelHelper, ldElem);

    IR::RegOpnd* maskOpnd = nullptr;
    if (CONFIG_FLAG_RELEASE(PoisonStringLoad))
    {
        // Mask off the sign before loading so that poisoning will work for negative indices
        if (index32CmpOpnd->IsIntConstOpnd())
        {
            charIndirOpnd->SetOffset((index32CmpOpnd->AsIntConstOpnd()->AsUint32() & INT32_MAX) * sizeof(char16));
        }
        else
        {
            InsertAnd(index32CmpOpnd, index32CmpOpnd, IR::IntConstOpnd::New(INT32_MAX, TyInt32, m_func), ldElem);
        }

        // All bits in mask will be 1 for a valid index or 0 for an OOB index
        maskOpnd = IR::RegOpnd::New(TyInt32, m_func);
        InsertSub(false, maskOpnd, index32CmpOpnd, lengthOpnd, ldElem);
        InsertShift(Js::OpCode::Shr_A, false, maskOpnd, maskOpnd, IR::IntConstOpnd::New(31, TyInt8, m_func), ldElem);
    }

    // Load the character and check if it is 7bit ASCI (which we have the cache for)
    //  MOV charOpnd, [bufferOpnd + index32Opnd]
    //  CMP charOpnd, 0x80
    //  JAE $helper
    IR::RegOpnd * charOpnd = IR::RegOpnd::New(TyUint32, this->m_func);
    const IR::AutoReuseOpnd autoReuseCharOpnd(charOpnd, m_func);
    InsertMove(charOpnd, charIndirOpnd, ldElem);

    if (CONFIG_FLAG_RELEASE(PoisonStringLoad))
    {
        InsertAnd(charOpnd, charOpnd, maskOpnd, ldElem);
    }

    InsertCompareBranch(charOpnd, IR::IntConstOpnd::New(Js::CharStringCache::CharStringCacheSize, TyUint16, this->m_func),
        Js::OpCode::BrGe_A, true, labelHelper, ldElem);

    // Load the string from the cache
    //  MOV charStringCache, <charStringCache, address>
    //  MOV stringOpnd, [charStringCache + charOpnd * 4]

    IR::RegOpnd * cacheOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
    const IR::AutoReuseOpnd autoReuseCacheOpnd(cacheOpnd, m_func);
    Assert(Js::JavascriptLibrary::GetCharStringCacheAOffset() == Js::JavascriptLibrary::GetCharStringCacheOffset());
    InsertMove(cacheOpnd, this->LoadLibraryValueOpnd(ldElem,  LibraryValue::ValueCharStringCache), ldElem);

    // Check if we have created the string or not
    //  TEST stringOpnd, stringOpnd
    //  JE $helper
    IR::RegOpnd * stringOpnd =  IR::RegOpnd::New(TyMachPtr, this->m_func);
    const IR::AutoReuseOpnd autoReuseStringOpnd(stringOpnd, m_func);
    InsertMove(stringOpnd, IR::IndirOpnd::New(cacheOpnd, charOpnd, this->m_lowererMD.GetDefaultIndirScale(), TyVar, this->m_func), ldElem);

    GenerateNotZeroTest(stringOpnd, labelHelper, ldElem);

    InsertMove(ldElem->GetDst(), stringOpnd, ldElem);
    InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);

    return true;
}